

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_3,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_80;
  Mat3 local_58;
  MatrixCaseUtils local_34 [12];
  Vec3 local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,3>(local_34,evalCtx,0);
  getInputValue<0,9>(&local_58,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x1,in_ECX);
  tcu::operator*((tcu *)&local_28,(Vector<float,_3> *)local_34,&local_58);
  reduceToVec3((MatrixCaseUtils *)&local_1c,&local_28);
  tcu::Vector<float,_4>::xyz(&local_80,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_80,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_58);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}